

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O1

EntryPtr __thiscall
cursespp::SimpleScrollAdapter::GetEntry
          (SimpleScrollAdapter *this,ScrollableWindow *window,size_t index)

{
  WINDOW **ppWVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Base_ptr p_Var3;
  SingleLineEntry *this_00;
  reference pvVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  size_type in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  iterator __position;
  PANEL **this_01;
  undefined1 auVar8 [16];
  EntryPtr EVar9;
  ulong local_58;
  SingleLineEntry *local_50;
  mapped_type local_48;
  Color local_40;
  Color local_38;
  
  local_58 = in_RCX;
  pvVar4 = std::
           deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
           ::at((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                 *)&(window->super_Window).contentColor,in_RCX);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)
       (pvVar4->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var2 = (pvVar4->super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->super_ScrollAdapterBase).width = (size_t)p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  _Var7._M_pi = extraout_RDX;
  if ((index != 0) && ((window->super_Window).lastNotifiedVisible == true)) {
    ppWVar1 = &(window->super_Window).frame;
    p_Var5 = (_Base_ptr)ppWVar1;
    for (p_Var3 = (_Base_ptr)(window->super_Window).contentPanel; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < local_58]) {
      if (*(ulong *)(p_Var3 + 1) >= local_58) {
        p_Var5 = p_Var3;
      }
    }
    __position._M_node = (_Base_ptr)ppWVar1;
    if ((p_Var5 != (_Base_ptr)ppWVar1) &&
       (__position._M_node = p_Var5, local_58 < *(ulong *)(p_Var5 + 1))) {
      __position._M_node = (_Base_ptr)ppWVar1;
    }
    local_50 = (SingleLineEntry *)
               (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter;
    auVar8 = (**(code **)(*(long *)index + 0x208))(index);
    this_00 = local_50;
    _Var7._M_pi = auVar8._8_8_;
    this_01 = &(window->super_Window).framePanel;
    if (local_58 == *(ulong *)(auVar8._0_8_ + 0x20)) {
      if (__position._M_node == (_Base_ptr)ppWVar1) {
        (*(local_50->super_IEntry)._vptr_IEntry[5])(&local_48,local_50,0);
        pmVar6 = std::
                 map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                 ::operator[]((map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                               *)this_01,&local_58);
        pmVar6->value = local_48.value;
      }
      local_38.value = 0x200;
      SingleLineEntry::SetAttrs(this_00,&local_38);
      _Var7._M_pi = extraout_RDX_00;
    }
    else if (__position._M_node != (_Base_ptr)ppWVar1) {
      local_40.value = (int64_t)__position._M_node[1]._M_parent;
      SingleLineEntry::SetAttrs(local_50,&local_40);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
                          *)this_01,__position);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var7._M_pi;
  EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (EntryPtr)
         EVar9.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

EntryPtr SimpleScrollAdapter::GetEntry(cursespp::ScrollableWindow* window, size_t index) {
    auto entry = this->entries.at(index);

    /* this is pretty damned gross, but super convenient; we always use SingleLineEntry
    internally, so we can do a static_cast<>. we allow the user to customize the
    color of the line when it's de-selected, so when it becomes selected we remember
    the original color. upon de-select, the color is restored (see indexToColor) */
    if (window && selectable) {
        SingleLineEntry* single = static_cast<SingleLineEntry*>(entry.get());
        auto it = indexToColor.find(index);
        if (index == window->GetScrollPosition().logicalIndex) {
            if (it == indexToColor.end()) {
                indexToColor[index] = single->GetAttrs(0);
            }
            single->SetAttrs(Color(Color::ListItemHighlighted));
        }
        else {
            if (it != indexToColor.end()) {
                single->SetAttrs(it->second);
                indexToColor.erase(it);
            }
        }
    }

    return entry;
}